

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

Vec4 __thiscall glcts::BlendExclusion(glcts *this,Vec4 *src,Vec4 *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec4 VVar5;
  Vec4 local_18;
  
  local_18.m_data[2] = src->m_data[2] * -2.0 * dst->m_data[2] + src->m_data[2] + dst->m_data[2];
  fVar1 = (float)*(undefined8 *)src->m_data;
  fVar2 = (float)((ulong)*(undefined8 *)src->m_data >> 0x20);
  fVar3 = (float)*(undefined8 *)dst->m_data;
  fVar4 = (float)((ulong)*(undefined8 *)dst->m_data >> 0x20);
  local_18.m_data[0] = fVar1 * -2.0 * fVar3 + fVar1 + fVar3;
  local_18.m_data[1] = fVar2 * -2.0 * fVar4 + fVar2 + fVar4;
  local_18.m_data[3] = 0.0;
  VVar5 = Blend(this,&local_18,src,dst);
  return (Vec4)VVar5.m_data;
}

Assistant:

static tcu::Vec4 BlendExclusion(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(Exclusion(src[0], dst[0]), Exclusion(src[1], dst[1]), Exclusion(src[2], dst[2]), 0.f);
	return Blend(rgb, src, dst);
}